

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterNaive.cpp
# Opt level: O2

StepStatus __thiscall
adios2::core::engine::ssc::SscWriterNaive::BeginStep
          (SscWriterNaive *this,StepMode mode,float timeoutSeconds,bool writerLocked)

{
  int64_t *piVar1;
  Buffer *this_00;
  
  piVar1 = &(this->super_SscWriterBase).m_CurrentStep;
  *piVar1 = *piVar1 + 1;
  this_00 = &(this->super_SscWriterBase).m_Buffer;
  Buffer::clear(this_00);
  Buffer::resize(this_00,0x10);
  std::
  vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
  ::clear(&this->m_Metadata);
  return OK;
}

Assistant:

StepStatus SscWriterNaive::BeginStep(const StepMode mode, const float timeoutSeconds,
                                     const bool writerLocked)
{
    ++m_CurrentStep;

    m_Buffer.clear();
    m_Buffer.resize(16);
    m_Metadata.clear();

    return StepStatus::OK;
}